

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmChkCmp2<(moira::Instr)145,(moira::Mode)5,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *pSVar3;
  Ea<(moira::Mode)5,_4> src;
  Av<(moira::Instr)145,_(moira::Mode)5,_4> local_48;
  u32 local_44;
  ushort local_40;
  u32 local_3c;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  local_40 = op & 7;
  local_44 = *addr;
  local_3c = dasmIncRead<2>(this,addr);
  if (((uVar2 & 0x7ff) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)145,(moira::Mode)5,4>(this,str,addr,op);
    return;
  }
  if ((uVar2 >> 0xb & 1) == 0) {
    pSVar3 = StrWriter::operator<<();
  }
  else {
    pSVar3 = StrWriter::operator<<(str);
  }
  pSVar3 = StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)5,_4> *)&local_44);
  StrWriter::operator<<(pSVar3);
  StrWriter::operator<<(pSVar3,(Rn)(uVar2 >> 0xc & 0xf));
  local_48.ext1 = 0;
  StrWriter::operator<<(str,&local_48);
  return;
}

Assistant:

void
Moira::dasmChkCmp2(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Rn       ( xxxx____________(ext)      );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {
            
            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    if (ext & 0x0800) {
        str << Ins<Instr::CHK2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    } else {
        str << Ins<Instr::CMP2>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    }
    str << Av<I, M, S>{};
}